

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromMatArray::load
          (Mat *__return_storage_ptr__,ModelBinFromMatArray *this,int param_1,int param_2)

{
  Mat *pMVar1;
  int *piVar2;
  int iVar3;
  Mat *m;
  
  pMVar1 = this->weights;
  if (pMVar1 != (Mat *)0x0) {
    __return_storage_ptr__->data = pMVar1->data;
    piVar2 = pMVar1->refcount;
    __return_storage_ptr__->refcount = piVar2;
    __return_storage_ptr__->elemsize = pMVar1->elemsize;
    __return_storage_ptr__->allocator = pMVar1->allocator;
    __return_storage_ptr__->dims = pMVar1->dims;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    iVar3 = pMVar1->h;
    __return_storage_ptr__->w = pMVar1->w;
    __return_storage_ptr__->h = iVar3;
    __return_storage_ptr__->c = pMVar1->c;
    __return_storage_ptr__->cstep = pMVar1->cstep;
    this->weights = this->weights + 1;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->elemsize = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!weights)
        return Mat();

    Mat m = weights[0];
    weights++;
    return m;
}